

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

bool __thiscall
icu_63::numparse::impl::AffixMatcher::match
          (AffixMatcher *this,StringSegment *segment,ParsedNumber *result,UErrorCode *status)

{
  bool bVar1;
  undefined1 uVar2;
  int32_t iVar3;
  int32_t iVar5;
  UnicodeString *this_00;
  AffixPatternMatcher *pAVar6;
  UnicodeString local_70;
  int iVar4;
  
  bVar1 = ParsedNumber::seenNumber(result);
  if (bVar1) {
    if ((((undefined1  [56])((undefined1  [56])(result->suffix).fUnion & (undefined1  [56])0x1) !=
          (undefined1  [56])0x0) && (this->fSuffix != (AffixPatternMatcher *)0x0)) &&
       (bVar1 = anon_unknown.dwarf_1f2941::matched(this->fPrefix,&result->prefix), bVar1)) {
      iVar3 = StringSegment::getOffset(segment);
      iVar4 = (*(this->fSuffix->super_ArraySeriesMatcher).super_SeriesMatcher.
                super_CompositionMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher[3])
                        (this->fSuffix,segment,result,status);
      uVar2 = (undefined1)iVar4;
      iVar5 = StringSegment::getOffset(segment);
      if (iVar3 == iVar5) {
        return (bool)uVar2;
      }
      this_00 = &result->suffix;
      pAVar6 = this->fSuffix;
LAB_002747c1:
      CompactUnicodeString<4>::toAliasedUnicodeString(&local_70,&pAVar6->fPattern);
      UnicodeString::moveFrom(this_00,&local_70);
      UnicodeString::~UnicodeString(&local_70);
      return (bool)uVar2;
    }
  }
  else if (((undefined1  [56])((undefined1  [56])(result->prefix).fUnion & (undefined1  [56])0x1) !=
            (undefined1  [56])0x0) && (this->fPrefix != (AffixPatternMatcher *)0x0)) {
    iVar3 = StringSegment::getOffset(segment);
    iVar4 = (*(this->fPrefix->super_ArraySeriesMatcher).super_SeriesMatcher.super_CompositionMatcher
              .super_NumberParseMatcher._vptr_NumberParseMatcher[3])
                      (this->fPrefix,segment,result,status);
    uVar2 = (undefined1)iVar4;
    iVar5 = StringSegment::getOffset(segment);
    if (iVar3 == iVar5) {
      return (bool)uVar2;
    }
    this_00 = &result->prefix;
    pAVar6 = this->fPrefix;
    goto LAB_002747c1;
  }
  return false;
}

Assistant:

bool AffixMatcher::match(StringSegment& segment, ParsedNumber& result, UErrorCode& status) const {
    if (!result.seenNumber()) {
        // Prefix
        // Do not match if:
        // 1. We have already seen a prefix (result.prefix != null)
        // 2. The prefix in this AffixMatcher is empty (prefix == null)
        if (!result.prefix.isBogus() || fPrefix == nullptr) {
            return false;
        }

        // Attempt to match the prefix.
        int initialOffset = segment.getOffset();
        bool maybeMore = fPrefix->match(segment, result, status);
        if (initialOffset != segment.getOffset()) {
            result.prefix = fPrefix->getPattern();
        }
        return maybeMore;

    } else {
        // Suffix
        // Do not match if:
        // 1. We have already seen a suffix (result.suffix != null)
        // 2. The suffix in this AffixMatcher is empty (suffix == null)
        // 3. The matched prefix does not equal this AffixMatcher's prefix
        if (!result.suffix.isBogus() || fSuffix == nullptr || !matched(fPrefix, result.prefix)) {
            return false;
        }

        // Attempt to match the suffix.
        int initialOffset = segment.getOffset();
        bool maybeMore = fSuffix->match(segment, result, status);
        if (initialOffset != segment.getOffset()) {
            result.suffix = fSuffix->getPattern();
        }
        return maybeMore;
    }
}